

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  float *pfVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  
  uVar2 = a->c;
  uVar8 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar10 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        pfVar7 = (float *)(a->cstep * uVar6 * a->elemsize + (long)a->data);
        pfVar9 = (float *)(c->cstep * uVar6 * c->elemsize + (long)c->data);
        fVar1 = *b->data;
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar10 = 3;
          do {
            fVar3 = pfVar7[1];
            fVar4 = pfVar7[2];
            fVar5 = pfVar7[3];
            *pfVar9 = *pfVar7 - fVar1;
            pfVar9[1] = fVar3 - fVar1;
            pfVar9[2] = fVar4 - fVar1;
            pfVar9[3] = fVar5 - fVar1;
            pfVar7 = pfVar7 + 4;
            pfVar9 = pfVar9 + 4;
            iVar10 = iVar10 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar10 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            pfVar9[lVar12] = pfVar7[lVar12] - fVar1;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}